

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_jp2h_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  opj_bool oVar6;
  long lVar7;
  uint uVar8;
  OPJ_UINT32 l_value;
  uint local_4c;
  opj_event_mgr_t *local_48;
  opj_jp2_v2_t *local_40;
  OPJ_UINT32 local_34;
  
  uVar4 = jp2->jp2_state;
  if ((uVar4 & 2) == 0) {
    pcVar5 = "The  box must be the first box in the file.\n";
LAB_001f7862:
    oVar6 = 0;
    opj_event_msg_v2(p_manager,1,pcVar5);
  }
  else {
    jp2->jp2_img_state = 0;
    local_48 = p_manager;
    local_40 = jp2;
    if (p_header_size != 0) {
      do {
        if (p_header_size < 8) {
          pcVar5 = "Cannot handle box of less than 8 bytes\n";
LAB_001f7842:
          p_manager = local_48;
          opj_event_msg_v2(local_48,1,pcVar5);
          pcVar5 = "Stream error while reading JP2 Header box\n";
          goto LAB_001f7862;
        }
        opj_read_bytes_LE(p_header_data,&local_4c,4);
        uVar4 = local_4c;
        opj_read_bytes_LE(p_header_data + 4,&local_4c,4);
        uVar8 = local_4c;
        if (uVar4 == 1) {
          if (p_header_size < 0x10) {
            pcVar5 = "Cannot handle XL box of less than 16 bytes\n";
          }
          else {
            opj_read_bytes_LE(p_header_data + 8,&local_34,4);
            if (local_34 == 0) {
              opj_read_bytes_LE(p_header_data + 0xc,&local_4c,4);
              if (local_4c == 0) goto LAB_001f7819;
              uVar2 = 0x10;
              uVar4 = local_4c;
              goto LAB_001f778f;
            }
            pcVar5 = "Cannot handle box sizes higher than 2^32\n";
          }
          goto LAB_001f7842;
        }
        uVar2 = 8;
        if (uVar4 == 0) {
LAB_001f7819:
          pcVar5 = "Cannot handle box of undefined sizes\n";
          goto LAB_001f7842;
        }
LAB_001f778f:
        if (p_header_size < uVar4) {
          pcVar5 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
          p_manager = local_48;
          goto LAB_001f7862;
        }
        lVar7 = 8;
        do {
          if (*(uint *)((long)&jp2_header[2].handler + lVar7) == uVar8) {
            uVar8 = uVar4 - uVar2;
            iVar3 = (**(code **)((long)&jp2_img_header[0].id + lVar7))
                              (local_40,p_header_data + uVar2,uVar8,local_48);
            if (iVar3 == 0) {
              return 0;
            }
            goto LAB_001f77e9;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x68);
        uVar8 = uVar4 - uVar2;
        pbVar1 = (byte *)((long)&local_40->jp2_img_state + 3);
        *pbVar1 = *pbVar1 | 0x80;
LAB_001f77e9:
        p_header_data = p_header_data + (ulong)uVar8 + (ulong)uVar2;
        p_header_size = p_header_size - uVar4;
      } while (p_header_size != 0);
      uVar4 = local_40->jp2_state;
      jp2 = local_40;
    }
    jp2->jp2_state = uVar4 | 4;
    oVar6 = 1;
  }
  return oVar6;
}

Assistant:

opj_bool jp2_read_jp2h_v2(
						opj_jp2_v2_t *jp2,
						unsigned char * p_header_data,
						unsigned int p_header_size,
						opj_event_mgr_t * p_manager
					)
{
	OPJ_UINT32 l_box_size=0, l_current_data_size = 0;
	opj_jp2_box_t box;
	const opj_jp2_header_handler_t * l_current_handler;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	/* make sure the box is well placed */
	if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The  box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	jp2->jp2_img_state = JP2_IMG_STATE_NONE;

	/* iterate while remaining data */
	while (p_header_size > 0) {

		if (! jp2_read_boxhdr_char(&box,p_header_data,&l_box_size,p_header_size, p_manager)) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box\n");
			return OPJ_FALSE;
		}

		if (box.length > p_header_size) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box: box length is inconsistent.\n");
			return OPJ_FALSE;
		}

		l_current_handler = jp2_img_find_handler(box.type);
		l_current_data_size = box.length - l_box_size;
		p_header_data += l_box_size;

		if (l_current_handler != 00) {
			if (! l_current_handler->handler(jp2,p_header_data,l_current_data_size,p_manager)) {
				return OPJ_FALSE;
			}
		}
		else {
			jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
		}

		p_header_data += l_current_data_size;
		p_header_size -= box.length;
	}

	jp2->jp2_state |= JP2_STATE_HEADER;

	return OPJ_TRUE;
}